

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::Array<capnp::compiler::NodeTranslator::BrandedDecl>::~Array
          (Array<capnp::compiler::NodeTranslator::BrandedDecl> *this)

{
  Array<capnp::compiler::NodeTranslator::BrandedDecl> *this_local;
  
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }